

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integer_cast_operator.hpp
# Opt level: O0

bool duckdb::TrySimpleIntegerCast<unsigned_short,_false>
               (char *buf,idx_t len,unsigned_short *result,bool strict)

{
  byte bVar1;
  bool bVar2;
  byte in_CL;
  undefined2 *in_RDX;
  IntegerDecimalCastData<unsigned_short> cast_data;
  IntegerCastData<unsigned_short> simple_data;
  undefined2 local_40;
  bool in_stack_ffffffffffffffc7;
  IntegerDecimalCastData<unsigned_short> *in_stack_ffffffffffffffc8;
  idx_t in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  undefined2 in_stack_ffffffffffffffdc;
  undefined1 in_stack_ffffffffffffffde;
  undefined1 local_1;
  
  bVar1 = in_CL & 1;
  bVar2 = TryIntegerCast<duckdb::IntegerCastData<unsigned_short>,_false,_false,_duckdb::IntegerCastOperation,_true,____>
                    ((char *)(CONCAT17(in_CL,CONCAT16(in_stack_ffffffffffffffde,
                                                      CONCAT24(in_stack_ffffffffffffffdc,
                                                               in_stack_ffffffffffffffd8))) &
                             0x1ffffffffffffff),in_stack_ffffffffffffffd0,
                     (IntegerCastData<unsigned_short> *)in_stack_ffffffffffffffc8,
                     in_stack_ffffffffffffffc7);
  if (bVar2) {
    *in_RDX = in_stack_ffffffffffffffdc;
    local_1 = true;
  }
  else {
    bVar2 = TryIntegerCast<duckdb::IntegerDecimalCastData<unsigned_short>,_false,_true,_duckdb::IntegerDecimalCastOperation,_true,____>
                      ((char *)CONCAT17(bVar1,CONCAT16(in_stack_ffffffffffffffde,
                                                       CONCAT24(in_stack_ffffffffffffffdc,
                                                                in_stack_ffffffffffffffd8))),
                       in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc7
                      );
    if (bVar2) {
      *in_RDX = local_40;
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

static inline bool TrySimpleIntegerCast(const char *buf, idx_t len, T &result, bool strict) {
	IntegerCastData<T> simple_data;
	if (TryIntegerCast<IntegerCastData<T>, IS_SIGNED, false, IntegerCastOperation>(buf, len, simple_data, strict)) {
		result = (T)simple_data.result;
		return true;
	}

	// Simple integer cast failed, try again with decimals/exponents included
	// FIXME: This could definitely be improved as some extra work is being done here. It is more important that
	//  "normal" integers (without exponent/decimals) are still being parsed quickly.
	IntegerDecimalCastData<T> cast_data;
	if (TryIntegerCast<IntegerDecimalCastData<T>, IS_SIGNED, true, IntegerDecimalCastOperation>(buf, len, cast_data,
	                                                                                            strict)) {
		result = (T)cast_data.result;
		return true;
	}
	return false;
}